

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O1

LY_ERR lyd_new_path(lyd_node *parent,ly_ctx *ctx,char *path,char *value,uint32_t options,
                   lyd_node **node)

{
  lysc_node *plVar1;
  ly_ctx *plVar2;
  LY_ERR LVar3;
  lys_module *plVar4;
  char *pcVar5;
  
  if (parent == (lyd_node *)0x0 && ctx == (ly_ctx *)0x0) {
    pcVar5 = "parent || ctx";
    ctx = (ly_ctx *)0x0;
  }
  else if (path == (char *)0x0) {
    pcVar5 = "path";
  }
  else if ((parent == (lyd_node *)0x0) && (*path != '/')) {
    pcVar5 = "(path[0] == \'/\') || parent";
  }
  else {
    if ((~options & 0xc) != 0) {
      if (parent != (lyd_node *)0x0) {
        plVar1 = parent->schema;
        if (plVar1 == (lysc_node *)0x0) {
          if (ctx == (ly_ctx *)0x0) goto LAB_0012e924;
          plVar2 = (ly_ctx *)parent[2].schema;
        }
        else {
          if (ctx == (ly_ctx *)0x0) goto LAB_0012e924;
          plVar2 = plVar1->module->ctx;
        }
        if (plVar2 != (ly_ctx *)0x0) {
          if (plVar1 == (lysc_node *)0x0) {
            plVar4 = (lys_module *)&parent[2].schema;
          }
          else {
            plVar4 = plVar1->module;
          }
          if (plVar4->ctx != ctx) {
            if (plVar1 == (lysc_node *)0x0) {
              plVar4 = (lys_module *)&parent[2].schema;
            }
            else {
              plVar4 = plVar1->module;
            }
            ly_log(plVar4->ctx,LY_LLERR,LY_EINVAL,
                   "Different contexts mixed in a single function call.");
            return LY_EINVAL;
          }
        }
      }
LAB_0012e924:
      LVar3 = lyd_new_path_(parent,ctx,(lysc_ext_instance *)0x0,path,value,0,LYD_ANYDATA_STRING,
                            options,node,(lyd_node **)0x0);
      return LVar3;
    }
    pcVar5 = "!(options & 0x04) || !(options & 0x08)";
  }
  ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar5,"lyd_new_path");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_path(struct lyd_node *parent, const struct ly_ctx *ctx, const char *path, const char *value, uint32_t options,
        struct lyd_node **node)
{
    LY_CHECK_ARG_RET(ctx, parent || ctx, path, (path[0] == '/') || parent,
            !(options & LYD_NEW_VAL_BIN) || !(options & LYD_NEW_VAL_CANON), LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(parent ? LYD_CTX(parent) : NULL, ctx, LY_EINVAL);

    return lyd_new_path_(parent, ctx, NULL, path, value, 0, LYD_ANYDATA_STRING, options, node, NULL);
}